

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_get_file_modified_time(char *pFilename,time_t *pTime)

{
  int iVar1;
  __time_t *in_RSI;
  char *in_RDI;
  stat64 file_stat;
  stat64 sStack_a8;
  __time_t *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  iVar1 = stat64(in_RDI,&sStack_a8);
  if (iVar1 == 0) {
    *local_18 = sStack_a8.st_mtim.tv_sec;
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static mz_bool mz_zip_get_file_modified_time(const char *pFilename,
                                             MZ_TIME_T *pTime) {
  struct MZ_FILE_STAT_STRUCT file_stat;

  /* On Linux with x86 glibc, this call will fail on large files (I think >=
   * 0x80000000 bytes) unless you compiled with _LARGEFILE64_SOURCE. Argh. */
  if (MZ_FILE_STAT(pFilename, &file_stat) != 0)
    return MZ_FALSE;

  *pTime = file_stat.st_mtime;

  return MZ_TRUE;
}